

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O3

AVisitor<hiberlite::LoadBean> * __thiscall
hiberlite::AVisitor<hiberlite::LoadBean>::operator&
          (AVisitor<hiberlite::LoadBean> *this,
          sql_nvp<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *nvp)

{
  pointer pcVar1;
  string local_40;
  
  pcVar1 = (nvp->name)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (nvp->name)._M_string_length);
  divePrefix(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  hibernate<hiberlite::AVisitor<hiberlite::LoadBean>,std::__cxx11::string,std::__cxx11::string>
            (this,nvp->value,0);
  popScope(this);
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(sql_nvp<X> nvp)
{
	divePrefix(nvp.name);
		walk(nvp.value);
	pop();
	return *this;
}